

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

X509_NAME_ENTRY *
X509_NAME_ENTRY_create_by_OBJ(X509_NAME_ENTRY **ne,ASN1_OBJECT *obj,int type,uchar *bytes,int len)

{
  int iVar1;
  X509_NAME_ENTRY *local_40;
  X509_NAME_ENTRY *ret;
  ossl_ssize_t len_local;
  uchar *bytes_local;
  int type_local;
  ASN1_OBJECT *obj_local;
  X509_NAME_ENTRY **ne_local;
  
  if ((ne == (X509_NAME_ENTRY **)0x0) || (*ne == (X509_NAME_ENTRY *)0x0)) {
    local_40 = X509_NAME_ENTRY_new();
    if (local_40 == (X509_NAME_ENTRY *)0x0) {
      return (X509_NAME_ENTRY *)0x0;
    }
  }
  else {
    local_40 = *ne;
  }
  iVar1 = X509_NAME_ENTRY_set_object(local_40,obj);
  if ((iVar1 == 0) || (iVar1 = X509_NAME_ENTRY_set_data(local_40,type,bytes,len), iVar1 == 0)) {
    if ((ne == (X509_NAME_ENTRY **)0x0) || (local_40 != *ne)) {
      X509_NAME_ENTRY_free(local_40);
    }
    ne_local = (X509_NAME_ENTRY **)0x0;
  }
  else {
    if ((ne != (X509_NAME_ENTRY **)0x0) && (*ne == (X509_NAME_ENTRY *)0x0)) {
      *ne = local_40;
    }
    ne_local = (X509_NAME_ENTRY **)local_40;
  }
  return (X509_NAME_ENTRY *)ne_local;
}

Assistant:

X509_NAME_ENTRY *X509_NAME_ENTRY_create_by_OBJ(X509_NAME_ENTRY **ne,
                                               const ASN1_OBJECT *obj, int type,
                                               const unsigned char *bytes,
                                               ossl_ssize_t len) {
  X509_NAME_ENTRY *ret;

  if ((ne == NULL) || (*ne == NULL)) {
    if ((ret = X509_NAME_ENTRY_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = *ne;
  }

  if (!X509_NAME_ENTRY_set_object(ret, obj)) {
    goto err;
  }
  if (!X509_NAME_ENTRY_set_data(ret, type, bytes, len)) {
    goto err;
  }

  if ((ne != NULL) && (*ne == NULL)) {
    *ne = ret;
  }
  return ret;
err:
  if ((ne == NULL) || (ret != *ne)) {
    X509_NAME_ENTRY_free(ret);
  }
  return NULL;
}